

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stcp.c
# Opt level: O1

void nn_stcp_term(nn_stcp *self)

{
  nn_fsm *self_00;
  
  self_00 = (nn_fsm *)(ulong)(uint)self->state;
  if (self->state == 1) {
    nn_fsm_event_term(&self->done);
    nn_msg_term(&self->outmsg);
    nn_msg_term(&self->inmsg);
    nn_pipebase_term(&self->pipebase);
    nn_streamhdr_term(&self->streamhdr);
    nn_fsm_term(&self->fsm);
    return;
  }
  nn_stcp_term_cold_1();
  nn_fsm_isidle(self_00);
  return;
}

Assistant:

void nn_stcp_term (struct nn_stcp *self)
{
    nn_assert_state (self, NN_STCP_STATE_IDLE);

    nn_fsm_event_term (&self->done);
    nn_msg_term (&self->outmsg);
    nn_msg_term (&self->inmsg);
    nn_pipebase_term (&self->pipebase);
    nn_streamhdr_term (&self->streamhdr);
    nn_fsm_term (&self->fsm);
}